

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  SUNMatrix_ID SVar1;
  long local_48;
  long local_40;
  sunindextype finish;
  sunindextype start;
  sunindextype j;
  sunindextype i;
  FILE *outfile_local;
  SUNMatrix A_local;
  
  SVar1 = SUNMatGetID(A);
  if (SVar1 == SUNMATRIX_BAND) {
    fprintf((FILE *)outfile,"\n");
    for (j = 0; j < *A->content; j = j + 1) {
      if (j - *(long *)((long)A->content + 0x20) < 0) {
        local_40 = 0;
      }
      else {
        local_40 = j - *(long *)((long)A->content + 0x20);
      }
      if (*(long *)((long)A->content + 8) + -1 < j + *(long *)((long)A->content + 0x18)) {
        local_48 = *(long *)((long)A->content + 8) + -1;
      }
      else {
        local_48 = j + *(long *)((long)A->content + 0x18);
      }
      for (start = 0; start < local_40; start = start + 1) {
        fprintf((FILE *)outfile,"%12s  ","");
      }
      for (start = local_40; start <= local_48; start = start + 1) {
        fprintf((FILE *)outfile,"%12g  ",
                *(undefined8 *)
                 (*(long *)(*(long *)((long)A->content + 0x40) + start * 8) +
                 ((j - start) + *(long *)((long)A->content + 0x28)) * 8));
      }
      fprintf((FILE *)outfile,"\n");
    }
    fprintf((FILE *)outfile,"\n");
  }
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  sunindextype i, j, start, finish;

  /* should not be called unless A is a band matrix; 
     otherwise return immediately */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return;

  /* perform operation */
  fprintf(outfile,"\n");
  for (i=0; i<SM_ROWS_B(A); i++) {
    start = SUNMAX(0, i-SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A)-1, i+SM_UBAND_B(A));
    for (j=0; j<start; j++)
      fprintf(outfile,"%12s  ","");
    for (j=start; j<=finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile,"%12Lg  ", SM_ELEMENT_B(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#else
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#endif
    }
    fprintf(outfile,"\n");
  }
  fprintf(outfile,"\n");
  return;
}